

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# termination_test.c
# Opt level: O2

void init_term_test(int converter,double src_ratio)

{
  bool bVar1;
  int error;
  ulong uVar2;
  long lVar3;
  uint uVar4;
  ulong uVar5;
  char *__format;
  double dVar6;
  SRC_DATA src_data;
  
  printf("\tinit_term_test   (SRC ratio = %7.4f) .......... ");
  fflush(_stdout);
  if (src_ratio < 1.0) {
    dVar6 = floor(src_ratio * 2048.0);
    bVar1 = 0x800 < (int)dVar6;
    uVar4 = 0x7f6;
  }
  else {
    dVar6 = floor(2048.0 / src_ratio);
    uVar4 = (int)dVar6 - 10;
    bVar1 = false;
  }
  for (lVar3 = 0; lVar3 != 0x2000; lVar3 = lVar3 + 4) {
    *(undefined4 *)((long)init_term_test::input + lVar3) = 0x3f800000;
  }
  if (bVar1) {
    printf("\n\nLine %d : output_len > SHORT_BUFFER_LEN\n\n",0x85);
    goto LAB_001016d4;
  }
  src_data.data_in = init_term_test::input;
  src_data.data_out = init_term_test::output;
  src_data.output_frames = 0x800;
  src_data.input_frames = (long)(int)uVar4;
  src_data.src_ratio = src_ratio;
  error = src_simple(&src_data,converter,1);
  if (error == 0) {
    dVar6 = ceil((double)(-(ulong)(1.0 <= src_ratio) & 0x3ff0000000000000 |
                         ~-(ulong)(1.0 <= src_ratio) & (ulong)(1.0 / src_ratio)));
    if ((double)(int)dVar6 <
        ABS((double)(int)uVar4 * src_ratio - (double)src_data.output_frames_gen)) {
      printf("\n\nLine %d : Bad output frame count.\n\n",0x99);
      printf("\tterminate             : %d\n",(ulong)(uint)(int)dVar6);
      printf("\tsrc_ratio             : %.4f\n",src_ratio);
      printf("\tinput_len             : %d\n\tinput_len * src_ratio : %f\n",
             (double)(int)uVar4 * src_ratio,(ulong)uVar4);
      printf("\toutput_frames_gen     : %ld\n\n",src_data.output_frames_gen);
      goto LAB_001016d4;
    }
    uVar2 = src_data.input_frames_used - (int)uVar4;
    uVar5 = -uVar2;
    if (0 < (long)uVar2) {
      uVar5 = uVar2;
    }
    if (uVar5 < 2) {
      if (0.1 <= ABS(init_term_test::output[0])) {
        puts("ok");
        return;
      }
      printf("\n\nLine %d : First output sample is bad.\n\n",0xab);
      printf("\toutput [0] == %f\n\n",(double)init_term_test::output[0]);
      goto LAB_001016d4;
    }
    printf("\n\nLine %d : input_frames_used should be %d, is %ld.\n\n",0xa4,(ulong)uVar4);
    printf("\tsrc_ratio  : %.4f\n",src_ratio);
    __format = "\tinput_len  : %d\n\tinput_used : %ld\n\n";
    uVar5 = (ulong)uVar4;
  }
  else {
    src_data.input_frames_used = (long)src_strerror(error);
    __format = "\n\nLine %d : %s\n\n";
    uVar5 = 0x92;
  }
  printf(__format,uVar5,src_data.input_frames_used);
LAB_001016d4:
  exit(1);
}

Assistant:

static void
init_term_test (int converter, double src_ratio)
{	static float input [SHORT_BUFFER_LEN], output [SHORT_BUFFER_LEN] ;

	SRC_DATA	src_data ;

	int k, input_len, output_len, error, terminate ;

	printf ("\tinit_term_test   (SRC ratio = %7.4f) .......... ", src_ratio) ;
	fflush (stdout) ;

	/* Calculate maximun input and output lengths. */
	if (src_ratio >= 1.0)
	{	output_len = SHORT_BUFFER_LEN ;
		input_len = (int) floor (SHORT_BUFFER_LEN / src_ratio) ;
		}
	else
	{	input_len = SHORT_BUFFER_LEN ;
		output_len = (int) floor (SHORT_BUFFER_LEN * src_ratio) ;
		} ;

	/* Reduce input_len by 10 so output is longer than necessary. */
	input_len -= 10 ;

	for (k = 0 ; k < ARRAY_LEN (input) ; k++)
		input [k] = 1.0 ;

	if (output_len > SHORT_BUFFER_LEN)
	{	printf ("\n\nLine %d : output_len > SHORT_BUFFER_LEN\n\n", __LINE__) ;
		exit (1) ;
		} ;

	src_data.data_in = input ;
	src_data.input_frames = input_len ;

	src_data.src_ratio = src_ratio ;

	src_data.data_out = output ;
	src_data.output_frames = SHORT_BUFFER_LEN ;

	if ((error = src_simple (&src_data, converter, 1)))
	{	printf ("\n\nLine %d : %s\n\n", __LINE__, src_strerror (error)) ;
		exit (1) ;
		} ;

	terminate = (int) ceil ((src_ratio >= 1.0) ? 1 : 1.0 / src_ratio) ;

	if (fabs (src_ratio * input_len - src_data.output_frames_gen) > terminate)
	{	printf ("\n\nLine %d : Bad output frame count.\n\n", __LINE__) ;
		printf ("\tterminate             : %d\n", terminate) ;
		printf ("\tsrc_ratio             : %.4f\n", src_ratio) ;
		printf ("\tinput_len             : %d\n"
				"\tinput_len * src_ratio : %f\n", input_len, input_len * src_ratio) ;
		printf ("\toutput_frames_gen     : %ld\n\n", src_data.output_frames_gen) ;
		exit (1) ;
		} ;

	if (labs (src_data.input_frames_used - input_len) > 1)
	{	printf ("\n\nLine %d : input_frames_used should be %d, is %ld.\n\n",
					 __LINE__, input_len, src_data.input_frames_used) ;
		printf ("\tsrc_ratio  : %.4f\n", src_ratio) ;
		printf ("\tinput_len  : %d\n\tinput_used : %ld\n\n", input_len, src_data.input_frames_used) ;
		exit (1) ;
		} ;

	if (fabs (output [0]) < 0.1)
	{	printf ("\n\nLine %d : First output sample is bad.\n\n", __LINE__) ;
		printf ("\toutput [0] == %f\n\n", output [0]) ;
		exit (1) ;
		}

	puts ("ok") ;

	return ;
}